

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_2_5::Xdr::skip<(anonymous_namespace)::CharIO,std::istream>
               (basic_istream<char,_std::char_traits<char>_> *in,int n)

{
  bool bVar1;
  int in_ESI;
  char c [1024];
  char *in_stack_fffffffffffffbe8;
  istream *in_stack_fffffffffffffbf0;
  int local_c;
  
  local_c = in_ESI;
  while( true ) {
    if (local_c < 0x400) {
      if (0 < local_c) {
        anon_unknown.dwarf_2084ed::CharIO::readChars
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,0);
      }
      return;
    }
    bVar1 = anon_unknown.dwarf_2084ed::CharIO::readChars
                      (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,0);
    if (!bVar1) break;
    local_c = local_c + -0x400;
  }
  return;
}

Assistant:

void
skip (T &in, int n)			// skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
	if (!S::readChars (in, c, sizeof (c)))
	    return;

	n -= sizeof (c);
    }

    if (n >= 1)
	S::readChars (in, c, n);
}